

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O0

float xsimd::kernel::reduce_add<xsimd::avx>
                (batch<float,_xsimd::avx> *rhs,requires_arch<avx> param_2)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  simd_register *in_RSI;
  register_type *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined8 in_YMM0_H;
  undefined8 in_register_00001218;
  undefined1 auVar3 [32];
  undefined1 in_ZMM1 [64];
  __m256 tmp;
  undefined1 local_140 [16];
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_40;
  
  auVar3 = in_ZMM1._0_32_;
  types::simd_register::operator_cast_to_function_pointer(in_RDI,in_RSI);
  types::simd_register::operator_cast_to_function_pointer(in_RDI,in_RSI);
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar1._16_8_ = in_YMM0_H;
  auVar1._24_8_ = in_register_00001218;
  auVar1 = vperm2f128_avx(auVar1,auVar3,1);
  auVar3 = auVar1;
  types::simd_register::operator_cast_to_function_pointer(in_RDI,in_RSI);
  local_e0 = auVar3._0_4_;
  uStack_dc = auVar3._4_4_;
  uStack_d8 = auVar3._8_4_;
  uStack_d4 = auVar3._12_4_;
  uStack_d0 = auVar3._16_4_;
  uStack_cc = auVar3._20_4_;
  uStack_c8 = auVar3._24_4_;
  uStack_c4 = auVar3._28_4_;
  local_100 = auVar1._0_4_;
  uStack_fc = auVar1._4_4_;
  uStack_f8 = auVar1._8_4_;
  uStack_f4 = auVar1._12_4_;
  uStack_f0 = auVar1._16_4_;
  uStack_ec = auVar1._20_4_;
  uStack_e8 = auVar1._24_4_;
  uStack_e4 = auVar1._28_4_;
  local_140._4_4_ = uStack_dc + uStack_fc;
  local_140._0_4_ = local_e0 + local_100;
  local_140._8_4_ = uStack_d8 + uStack_f8;
  local_140._12_4_ = uStack_d4 + uStack_f4;
  uStack_130._0_4_ = uStack_d0 + uStack_f0;
  uStack_130._4_4_ = uStack_cc + uStack_ec;
  uStack_128._0_4_ = uStack_c8 + uStack_e8;
  uStack_128._4_4_ = uStack_c4 + uStack_e4;
  auVar1 = _local_140;
  uStack_128 = auVar1._24_8_;
  auVar2._16_8_ = uStack_130;
  auVar2._0_16_ = local_140;
  auVar2._24_8_ = uStack_128;
  auVar3._16_8_ = uStack_130;
  auVar3._0_16_ = local_140;
  auVar3._24_8_ = uStack_128;
  auVar1 = vhaddps_avx(auVar2,auVar3);
  auVar1 = vhaddps_avx(auVar1,auVar1);
  local_40 = auVar1._0_4_;
  return local_40;
}

Assistant:

inline float reduce_add(batch<float, A> const& rhs, requires_arch<avx>) noexcept
        {
            // Warning about _mm256_hadd_ps:
            // _mm256_hadd_ps(a,b) gives
            // (a0+a1,a2+a3,b0+b1,b2+b3,a4+a5,a6+a7,b4+b5,b6+b7). Hence we can't
            // rely on a naive use of this method
            // rhs = (x0, x1, x2, x3, x4, x5, x6, x7)
            // tmp = (x4, x5, x6, x7, x0, x1, x2, x3)
            __m256 tmp = _mm256_permute2f128_ps(rhs, rhs, 1);
            // tmp = (x4+x0, x5+x1, x6+x2, x7+x3, x0+x4, x1+x5, x2+x6, x3+x7)
            tmp = _mm256_add_ps(rhs, tmp);
            // tmp = (x4+x0+x5+x1, x6+x2+x7+x3, -, -, -, -, -, -)
            tmp = _mm256_hadd_ps(tmp, tmp);
            // tmp = (x4+x0+x5+x1+x6+x2+x7+x3, -, -, -, -, -, -, -)
            tmp = _mm256_hadd_ps(tmp, tmp);
            return _mm_cvtss_f32(_mm256_extractf128_ps(tmp, 0));
        }